

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void ranges(void)

{
  size_t i;
  rtosc_arg_val_t r [8];
  rtosc_arg_val_t l [8];
  undefined8 in_stack_fffffffffffffe58;
  int32_t len;
  char type;
  rtosc_arg_val_t *in_stack_fffffffffffffe60;
  char *pcVar1;
  rtosc_arg_val_t *arg;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe6c;
  rtosc_cmp_options *opt;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffffe79;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe84;
  rtosc_arg_val_t *in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe90;
  undefined1 uVar5;
  undefined7 in_stack_fffffffffffffe91;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int line;
  
  len = (int32_t)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  rtosc_av_arr_len_set(in_stack_fffffffffffffe60,len);
  type = (char)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  rtosc_av_arr_type_set(in_stack_fffffffffffffe60,type);
  rtosc_av_rep_has_delta_set(in_stack_fffffffffffffe60,len);
  rtosc_av_rep_num_set(in_stack_fffffffffffffe60,len);
  uVar3 = 0x61;
  rtosc_av_arr_len_set(in_stack_fffffffffffffe60,len);
  rtosc_av_arr_type_set(in_stack_fffffffffffffe60,type);
  for (opt = (rtosc_cmp_options *)0x0; opt < (rtosc_cmp_options *)0x5;
      opt = (rtosc_cmp_options *)((long)&opt->float_tolerance + 1)) {
    (&stack0xfffffffffffffe78)[(long)((long)&opt->float_tolerance + 1) * 0x18] = 0x69;
    *(int *)(&stack0xfffffffffffffe80 + (long)((long)&opt->float_tolerance + 1) * 0x18) =
         (int)opt + 1;
  }
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
        (size_t)in_stack_fffffffffffffe88,
        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
        in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  pcVar1 = "[1 2 3 4 5]";
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
        (size_t)in_stack_fffffffffffffe88,
        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
        in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  rtosc_av_rep_has_delta_set((rtosc_arg_val_t *)pcVar1,0);
  rtosc_av_rep_num_set((rtosc_arg_val_t *)pcVar1,0);
  pcVar1 = "1 2 3 ... 7";
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
        (size_t)in_stack_fffffffffffffe88,
        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
        in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  rtosc_av_rep_num_set((rtosc_arg_val_t *)pcVar1,0);
  uVar4 = 0;
  uVar2 = 0x11e;
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
        (size_t)in_stack_fffffffffffffe88,
        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
        in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  arg = (rtosc_arg_val_t *)CONCAT44(uVar4,0x124);
  cmp_gt((rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
         in_stack_fffffffffffffe88,CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
         CONCAT71(in_stack_fffffffffffffe79,uVar3),opt,
         (char *)CONCAT44(in_stack_fffffffffffffe6c,uVar2),
         (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
         in_stack_fffffffffffffea8);
  rtosc_av_rep_num_set(arg,0);
  pcVar1 = "infinite range";
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
        (size_t)in_stack_fffffffffffffe88,
        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
        in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  rtosc_av_rep_has_delta_set((rtosc_arg_val_t *)pcVar1,0);
  rtosc_av_rep_num_set((rtosc_arg_val_t *)pcVar1,0);
  uVar3 = 0x69;
  uVar4 = 1;
  uVar5 = 0x2d;
  rtosc_av_rep_has_delta_set((rtosc_arg_val_t *)pcVar1,0);
  rtosc_av_rep_num_set((rtosc_arg_val_t *)pcVar1,0);
  line = CONCAT31((int3)((uint)in_stack_fffffffffffffec0 >> 8),0x69);
  pcVar1 = "infinite_range";
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,uVar5),
        (size_t)in_stack_fffffffffffffe88,CONCAT44(in_stack_fffffffffffffe84,uVar4),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,1),in_stack_fffffffffffffeb8,line);
  rtosc_av_rep_has_delta_set((rtosc_arg_val_t *)pcVar1,0);
  uVar2 = 1;
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,uVar5),
        (size_t)in_stack_fffffffffffffe88,CONCAT44(in_stack_fffffffffffffe84,uVar4),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,1),in_stack_fffffffffffffeb8,line);
  pcVar1 = "infinite_range (no delta)";
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,uVar5),
        (size_t)in_stack_fffffffffffffe88,CONCAT44(in_stack_fffffffffffffe84,uVar4),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),in_stack_fffffffffffffeb8,line);
  rtosc_av_rep_num_set((rtosc_arg_val_t *)pcVar1,0);
  rtosc_av_rep_has_delta_set((rtosc_arg_val_t *)pcVar1,0);
  pcVar1 = "infinite_range (no delta)";
  cmp_1(in_stack_fffffffffffffea4,
        (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,uVar5),
        (size_t)in_stack_fffffffffffffe88,CONCAT44(in_stack_fffffffffffffe84,uVar4),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),in_stack_fffffffffffffeb8,line);
  uVar3 = 0x2d;
  rtosc_av_rep_num_set((rtosc_arg_val_t *)pcVar1,0);
  rtosc_av_rep_has_delta_set((rtosc_arg_val_t *)pcVar1,0);
  cmp_1(in_stack_fffffffffffffea4,(rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffe9c,1),
        (rtosc_arg_val_t *)CONCAT71(in_stack_fffffffffffffe91,0x69),
        (size_t)in_stack_fffffffffffffe88,CONCAT44(in_stack_fffffffffffffe84,uVar4),
        (rtosc_cmp_options *)CONCAT71(in_stack_fffffffffffffe79,uVar3),
        (char *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),in_stack_fffffffffffffeb8,line);
  return;
}

Assistant:

void ranges()
{
    rtosc_arg_val_t l[8], r[8];

    // generate range 1 ... 5 inside of an array
    l[0].type = 'a';
    rtosc_av_arr_len_set(l, 3); // number of arg_val_t inside
    rtosc_av_arr_type_set(l, 'i');
    l[1].type = '-';
    rtosc_av_rep_has_delta_set(l+1, 1);
    rtosc_av_rep_num_set(l+1, 5);
    l[2].type = 'i';
    l[2].val.i = 1;
    l[3].type = 'i';
    l[3].val.i = 1;

    r[0].type = 'a';
    rtosc_av_arr_len_set(r, 5);
    rtosc_av_arr_type_set(r, 'i');
    for(size_t i = 0; i < 5; ++i) {
        r[i+1].type = 'i';
        r[i+1].val.i = i+1;
    }

    cmp_1(eq, l+1, r+1, 3, 5, NULL,
          "range 1 ... 5", "integers 1 2 3 4 5", __LINE__);

    cmp_1(eq, l, r, 4, 6, NULL,
          "[1 ... 5]", "[1 2 3 4 5]", __LINE__);

    // let l+1 = 1 ... 5 6 7
    // and r+1 = 1 2 3 4 ... 7
    l[4].val.i = 6;
    l[5].val.i = 7;
    l[4].type = l[5].type = 'i';
    r[4].type = '-';
    rtosc_av_rep_has_delta_set(r+4, 1);
    rtosc_av_rep_num_set(r+4, 4);
    r[5].type = 'i';
    r[5].val.i = 1;
    r[6].type = 'i';
    r[6].val.i = 4;

    cmp_1(eq, l+1, r+1, 5, 6, NULL,
          "1 ... 5 6 7", "1 2 3 ... 7", __LINE__);

    // keep    l+1 = 1 ... 5 6 7
    // and let r+1 = 1 2 3 4 ...
    rtosc_av_rep_num_set(r+4, 0);
    //r[6].type = 'x';

    cmp_1(eq, l+1, r+1, 5, 6, NULL,
          "1 ... 5 6 7", "1 2 3 4 ...", __LINE__);

    // let      l+1 = 1 ... 5 6 6
    // and keep r+1 = 1 2 3 4 ...
    l[5].val.i = 6;
    // careful! r and l are swapped!
    cmp_gt(r+1, l+1, 6, 5, NULL, "infinite range", "integers", __LINE__);

    // let      l+1 = 1 ... 7
    // and keep r+1 = 1 2 3 4 ...
    rtosc_av_rep_num_set(l+1, 7);
    cmp_1(eq, l+1, r+1, 3, 7, NULL, "finite range", "infinite range", __LINE__);

    // let l = 1 2 3 ...
    // and r = 1 2 ...
    l[0].type = l[1].type = 'i';
    l[0].val.i = 1; l[1].val.i = 2;
    l[2].type = '-';
    rtosc_av_rep_has_delta_set(l+2, 1);
    rtosc_av_rep_num_set(l+2, 0);
    l[3].type = l[4].type = 'i';
    l[3].val.i = 3; l[4].val.i = 1;

    r[0].type = 'i';
    r[0].val.i = 1;
    r[1].type = '-';
    rtosc_av_rep_has_delta_set(r+1, 1);
    rtosc_av_rep_num_set(r+1, 0);
    r[2].type = r[3].type = 'i';
    r[2].val.i = 1; r[3].val.i = 2;

    cmp_1(eq, l, r, 5, 4, NULL,
          "infinite range", "infinite_range", __LINE__);

    // let l = 1 1 1
    // and r = 1 1 ...
    l[1].val.i = 1;
    l[2].type = 'i';
    l[2].val.i = 1;
    rtosc_av_rep_has_delta_set(r+1, 0);
    r[2].val.i = 1;

    cmp_1(eq, l, r, 3, 3, NULL,
      "numbers", "infinite_range (no delta)", __LINE__);

    // let      l = 1
    // and keep r = 1 1 ...
    cmp_1(eq, l, r, 1, 3, NULL,
      "nothing", "infinite_range (no delta)", __LINE__);

    // let      l = 1 ...
    // and keep r = 1 1 ...
    l[0].type = '-';
    rtosc_av_rep_num_set(l, 0);
    rtosc_av_rep_has_delta_set(l, 0);
    l[1].type = 'i';
    l[1].val.i = 1;
    cmp_1(eq, l, r, 2, 3, NULL,
      "infinite_range (no delta)", "infinite_range (no delta)", __LINE__);


    // keep     l = 1 ...
    // and let  r = 1 ...
    r[0].type = '-';
    rtosc_av_rep_num_set(r, 0);
    rtosc_av_rep_has_delta_set(r, 0);
    r[1].type = 'i';
    r[1].val.i = 1;
    cmp_1(eq, l, r, 2, 2, NULL, "1 ...", "1 ...", __LINE__);
}